

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

gint events_array_compare_function(gconstpointer aa,gconstpointer bb)

{
  long lVar1;
  long lVar2;
  smf_event_t *b;
  smf_event_t *a;
  gconstpointer bb_local;
  gconstpointer aa_local;
  
  lVar1 = *aa;
  lVar2 = *bb;
  if (*(int *)(lVar1 + 0x10) < *(int *)(lVar2 + 0x10)) {
    aa_local._4_4_ = -1;
  }
  else if (*(int *)(lVar2 + 0x10) < *(int *)(lVar1 + 0x10)) {
    aa_local._4_4_ = 1;
  }
  else if (*(int *)(lVar1 + 8) < *(int *)(lVar2 + 8)) {
    aa_local._4_4_ = -1;
  }
  else if (*(int *)(lVar2 + 8) < *(int *)(lVar1 + 8)) {
    aa_local._4_4_ = 1;
  }
  else {
    aa_local._4_4_ = 0;
  }
  return aa_local._4_4_;
}

Assistant:

static gint
events_array_compare_function(gconstpointer aa, gconstpointer bb)
{
	smf_event_t *a, *b;
	
	/* "The comparison function for g_ptr_array_sort() doesn't take the pointers
	    from the array as arguments, it takes pointers to the pointers in the array." */
	a = (smf_event_t *)*(gpointer *)aa;
	b = (smf_event_t *)*(gpointer *)bb;

	if (a->time_pulses < b->time_pulses)
		return (-1);

	if (a->time_pulses > b->time_pulses)
		return (1);

	/*
	 * We need to preserve original order, otherwise things will break
	 * when there are several events with the same ->time_pulses.
	 * XXX: This is an ugly hack; we should remove sorting altogether.
	 */

	if (a->event_number < b->event_number)
		return (-1);

	if (a->event_number > b->event_number)
		return (1);

	return (0);
}